

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void mkdir_cb(uv_fs_t *req)

{
  int iVar1;
  uv_fs_t *req_local;
  
  if (req != &mkdir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x204,"req == &mkdir_req");
    abort();
  }
  if (mkdir_req.fs_type != UV_FS_MKDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x205,"req->fs_type == UV_FS_MKDIR");
    abort();
  }
  if (mkdir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x206,"req->result == 0");
    abort();
  }
  mkdir_cb_count = mkdir_cb_count + 1;
  if (mkdir_req.path == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x208,"req->path");
    abort();
  }
  iVar1 = memcmp(mkdir_req.path,"test_dir",9);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x209,"memcmp(req->path, \"test_dir\\0\", 9) == 0");
    abort();
  }
  uv_fs_req_cleanup(&mkdir_req);
  return;
}

Assistant:

static void mkdir_cb(uv_fs_t* req) {
  ASSERT(req == &mkdir_req);
  ASSERT(req->fs_type == UV_FS_MKDIR);
  ASSERT(req->result == 0);
  mkdir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
}